

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O3

void __thiscall
slang::parsing::Preprocessor::handleProtectViewport
          (Preprocessor *this,Token keyword,PragmaExpressionSyntax *args,
          SmallVectorBase<slang::parsing::Token> *param_3)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar1;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> this_00;
  SyntaxNode *this_01;
  string_view sVar2;
  SourceRange SVar3;
  Token local_30;
  
  local_30.info = keyword.info;
  local_30._0_8_ = keyword._0_8_;
  if (args == (PragmaExpressionSyntax *)0x0) {
    SVar3 = Token::range(&local_30);
LAB_006963cb:
    addDiag(this,(DiagCode)0x250004,SVar3);
    return;
  }
  if (((args->super_SyntaxNode).kind != ParenPragmaExpression) ||
     (((ulong)((long)&(args[3].super_SyntaxNode.previewNode)->kind + 1U) & 0xfffffffffffffffe) != 4)
     ) {
    SVar3 = slang::syntax::SyntaxNode::sourceRange(&args->super_SyntaxNode);
    goto LAB_006963cb;
  }
  ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                      ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                       args[3].super_SyntaxNode.parent);
  this_01 = *ppSVar1;
  if (this_01->kind == NameValuePragmaExpression) {
    this_00 = this_01 + 1;
    sVar2 = Token::valueText((Token *)this_00);
    if ((sVar2._M_len != 6) ||
       ((short)*(int *)((long)sVar2._M_str + 4) != 0x7463 || *(int *)sVar2._M_str != 0x656a626f)) {
LAB_006963b0:
      SVar3 = Token::range((Token *)this_00);
      goto LAB_006963f2;
    }
    this_01 = this_01[2].parent;
    if ((this_01->kind == SimplePragmaExpression) &&
       ((short)this_01[1].kind == AcceptOnPropertyExpr)) {
      ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           (args[3].super_SyntaxNode.parent + 2));
      this_01 = *ppSVar1;
      if (this_01->kind == NameValuePragmaExpression) {
        this_00 = this_01 + 1;
        sVar2 = Token::valueText((Token *)this_00);
        if ((sVar2._M_len != 6) ||
           ((short)*(int *)((long)sVar2._M_str + 4) != 0x7373 || *(int *)sVar2._M_str != 0x65636361)
           ) goto LAB_006963b0;
        this_01 = this_01[2].parent;
        if ((this_01->kind == SimplePragmaExpression) &&
           ((short)this_01[1].kind == AcceptOnPropertyExpr)) {
          return;
        }
      }
    }
  }
  SVar3 = slang::syntax::SyntaxNode::sourceRange(this_01);
LAB_006963f2:
  addDiag(this,(DiagCode)0x250004,SVar3);
  return;
}

Assistant:

void Preprocessor::handleProtectViewport(Token keyword, const PragmaExpressionSyntax* args,
                                         SmallVectorBase<Token>&) {
    if (!args || args->kind != SyntaxKind::ParenPragmaExpression ||
        args->as<ParenPragmaExpressionSyntax>().values.size() != 2) {
        addDiag(diag::InvalidPragmaViewport, args ? args->sourceRange() : keyword.range());
        return;
    }

    auto checkOption = [&](size_t index, std::string_view name) {
        auto syntax = args->as<ParenPragmaExpressionSyntax>().values[index];
        if (syntax->kind != SyntaxKind::NameValuePragmaExpression) {
            addDiag(diag::InvalidPragmaViewport, syntax->sourceRange());
            return false;
        }

        auto& nvp = syntax->as<NameValuePragmaExpressionSyntax>();
        if (nvp.name.valueText() != name) {
            addDiag(diag::InvalidPragmaViewport, nvp.name.range());
            return false;
        }

        if (nvp.value->kind != SyntaxKind::SimplePragmaExpression ||
            nvp.value->as<SimplePragmaExpressionSyntax>().value.kind != TokenKind::StringLiteral) {
            addDiag(diag::InvalidPragmaViewport, nvp.value->sourceRange());
            return false;
        }

        return true;
    };

    if (!checkOption(0, "object"sv))
        return;

    checkOption(1, "access"sv);
}